

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedResult.cpp
# Opt level: O0

void __thiscall
oout::TimedResult::TimedResult
          (TimedResult *this,shared_ptr<const_oout::Result> *result,nanoseconds *duration)

{
  nanoseconds *duration_local;
  shared_ptr<const_oout::Result> *result_local;
  TimedResult *this_local;
  
  Result::Result(&this->super_Result);
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__TimedResult_00325938;
  std::shared_ptr<const_oout::Result>::shared_ptr(&this->result,result);
  (this->duration).__r = duration->__r;
  return;
}

Assistant:

TimedResult::TimedResult(
	const shared_ptr<const Result> &result,
	const chrono::nanoseconds &duration
) : result(result), duration(duration)
{
}